

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchSCHashTable.c
# Opt level: O1

void Fxch_SCHashTableDelete(Fxch_SCHashTable_t *pSCHashTable)

{
  Fxch_SubCube_t *__ptr;
  int *piVar1;
  uint uVar2;
  
  uVar2 = 0;
  do {
    __ptr = pSCHashTable->pBins[uVar2].vSCData;
    if (__ptr != (Fxch_SubCube_t *)0x0) {
      free(__ptr);
      pSCHashTable->pBins[uVar2].vSCData = (Fxch_SubCube_t *)0x0;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 <= pSCHashTable->SizeMask);
  piVar1 = (pSCHashTable->vSubCube0).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (pSCHashTable->vSubCube0).pArray = (int *)0x0;
  }
  (pSCHashTable->vSubCube0).nCap = 0;
  (pSCHashTable->vSubCube0).nSize = 0;
  piVar1 = (pSCHashTable->vSubCube1).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (pSCHashTable->vSubCube1).pArray = (int *)0x0;
  }
  (pSCHashTable->vSubCube1).nCap = 0;
  (pSCHashTable->vSubCube1).nSize = 0;
  if (pSCHashTable->pBins != (Fxch_SCHashTable_Entry_t *)0x0) {
    free(pSCHashTable->pBins);
    pSCHashTable->pBins = (Fxch_SCHashTable_Entry_t *)0x0;
  }
  if (pSCHashTable != (Fxch_SCHashTable_t *)0x0) {
    free(pSCHashTable);
    return;
  }
  return;
}

Assistant:

void Fxch_SCHashTableDelete( Fxch_SCHashTable_t* pSCHashTable )
{
    unsigned i;
    for ( i = 0; i <= pSCHashTable->SizeMask; i++ )
        ABC_FREE( pSCHashTable->pBins[i].vSCData );
    Vec_IntErase( &pSCHashTable->vSubCube0 );
    Vec_IntErase( &pSCHashTable->vSubCube1 );
    ABC_FREE( pSCHashTable->pBins );
    ABC_FREE( pSCHashTable );
}